

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O1

void __thiscall
anurbs::PointOnCurveProjection<2L>::compute
          (PointOnCurveProjection<2L> *this,Vector *sample,double max_distance)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pdVar3;
  pointer pMVar4;
  undefined1 auVar5 [16];
  pointer pMVar6;
  double *pdVar7;
  double *pdVar8;
  _Tuple_impl<3UL,_long> _Var9;
  _Head_base<2UL,_double,_false> _Var10;
  long lVar11;
  long lVar12;
  bool bVar13;
  ulong uVar14;
  double extraout_XMM0_Qa;
  double *pdVar15;
  double dVar16;
  double dVar17;
  double dVar19;
  undefined1 auVar18 [16];
  double dVar20;
  double dVar21;
  double in_XMM1_Qa;
  double dVar22;
  undefined8 in_XMM1_Qb;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 in_XMM4 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double *in_XMM6_Qa;
  double in_XMM6_Qb;
  double dVar27;
  double dVar28;
  double dVar29;
  double *in_XMM9_Qa;
  double in_XMM9_Qb;
  double dVar30;
  Vector point_at_t0;
  Vector point_at_t1;
  undefined1 local_d8 [16];
  tuple<double,_long,_double,_long> local_b8;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  _Head_base<3UL,_long,_false> local_78;
  double dStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  double *local_58;
  double dStack_50;
  Vector local_48;
  
  peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_CurveBase[3])();
  local_98 = in_XMM1_Qa;
  uStack_90 = in_XMM1_Qb;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  local_d8 = ZEXT816(0);
  if (max_distance <= 0.0) {
    pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)(this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
    local_78._M_head_impl = (long)in_XMM9_Qa;
    dStack_70 = in_XMM9_Qb;
    if (1 < lVar11) {
      dVar17 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
               m_data.array[0];
      dVar21 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
               m_data.array[1];
      lVar12 = 1;
      local_d8 = ZEXT816(0);
      dVar24 = INFINITY;
      pMVar6 = (this->m_tessellation).second.
               super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        dVar16 = pdVar3[lVar12 + 0xffffffffffffffff];
        pdVar7 = *(double **)
                  &(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                   m_data;
        dVar22 = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                 m_data.array[1];
        pdVar8 = *(double **)
                  &pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                   m_data;
        dVar29 = pMVar6[1].super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                 m_data.array[1];
        dVar27 = (double)pdVar8 - (double)pdVar7;
        dVar28 = dVar29 - dVar22;
        dVar30 = dVar28 * dVar28 + dVar27 * dVar27;
        dVar20 = dVar16;
        pdVar15 = pdVar7;
        dVar19 = dVar22;
        if (((1e-14 <= dVar30) &&
            (dVar30 = 1.0 / dVar30,
            dVar30 = (dVar21 - dVar22) * dVar30 * dVar28 +
                     (dVar17 - (double)pdVar7) * dVar30 * dVar27, 0.0 <= dVar30)) &&
           (dVar20 = pdVar3[lVar12], pdVar15 = pdVar8, dVar19 = dVar29, dVar30 <= 1.0)) {
          dVar20 = dVar16 + (dVar20 - dVar16) * dVar30;
          pdVar15 = (double *)((double)pdVar7 + dVar27 * dVar30);
          dVar19 = dVar22 + dVar28 * dVar30;
        }
        dVar16 = (double)pdVar15 - dVar17;
        dVar29 = dVar19 - dVar21;
        dVar29 = dVar29 * dVar29;
        dVar22 = dVar29 + dVar16 * dVar16;
        dVar16 = dVar22;
        if (dVar24 <= dVar22) {
          dVar16 = dVar24;
          dVar19 = in_XMM6_Qb;
          pdVar15 = in_XMM6_Qa;
        }
        in_XMM6_Qa = pdVar15;
        in_XMM6_Qb = dVar19;
        auVar18._0_8_ = ~-(ulong)(dVar22 < dVar24) & local_d8._0_8_;
        auVar18._8_8_ = ~(ulong)dVar29 & local_d8._8_8_;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (ulong)dVar20 & -(ulong)(dVar22 < dVar24);
        local_d8 = auVar18 | auVar25;
        lVar12 = lVar12 + 1;
        in_XMM4 = local_d8;
        dVar24 = dVar16;
        local_78._M_head_impl = (long)in_XMM6_Qa;
        dStack_70 = in_XMM6_Qb;
        pMVar6 = pMVar6 + 1;
      } while (lVar11 != lVar12);
    }
  }
  else {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0];
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1]
         = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1];
    PolylineMapper<2L>::map
              (&local_b8,
               (this->mapper)._M_t.
               super___uniq_ptr_impl<anurbs::PolylineMapper<2L>,_std::default_delete<anurbs::PolylineMapper<2L>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_anurbs::PolylineMapper<2L>_*,_std::default_delete<anurbs::PolylineMapper<2L>_>_>
               .super__Head_base<0UL,_anurbs::PolylineMapper<2L>_*,_false>._M_head_impl,&local_48,
               max_distance);
    pdVar3 = (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pMVar4 = (this->m_tessellation).second.
             super__Vector_base<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_d8._0_8_ =
         pdVar3[local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>.
                _M_head_impl] *
         local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl +
         pdVar3[(long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                      super__Tuple_impl<1UL,_long,_double,_long>.
                      super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                      super__Head_base<3UL,_long,_false>._M_head_impl] *
         local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
         super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
         super__Head_base<2UL,_double,_false>._M_head_impl;
    local_d8._8_8_ = 0;
    pMVar6 = pMVar4 + local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                      super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>.
                      _M_head_impl;
    pMVar4 = pMVar4 + (long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                            super__Tuple_impl<1UL,_long,_double,_long>.
                            super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                            super__Head_base<3UL,_long,_false>._M_head_impl;
    local_78._M_head_impl =
         (long)(local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
                super__Head_base<2UL,_double,_false>._M_head_impl *
                (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                m_data.array[0] +
               local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
               super__Head_base<0UL,_double,_false>._M_head_impl *
               (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
               m_data.array[0]);
    dStack_70 = local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
                super__Head_base<2UL,_double,_false>._M_head_impl *
                (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                m_data.array[1] +
                local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                super__Head_base<0UL,_double,_false>._M_head_impl *
                (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                m_data.array[1];
  }
  dVar17 = this->m_tolerance;
  local_68 = SUB84(local_98,0);
  uStack_64 = (undefined4)((ulong)local_98 >> 0x20);
  uStack_60 = (undefined4)uStack_90;
  uStack_5c = (undefined4)((ulong)uStack_90 >> 0x20);
  if (extraout_XMM0_Qa <= local_98) {
    local_68 = SUB84(extraout_XMM0_Qa,0);
    uStack_64 = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  local_80 = local_98;
  if (local_98 <= extraout_XMM0_Qa) {
    local_80 = extraout_XMM0_Qa;
  }
  lVar11 = 4;
  do {
    peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_CurveBase[6])(&local_b8,peVar1,2);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    dVar21 = *(double *)
              ((long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl +
              0x10);
    dVar24 = *(double *)
              ((long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl +
              0x18);
    dVar16 = *(double *)
              local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
              super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
              super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl -
             (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[0];
    dVar20 = *(double *)
              ((long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl +
              8) - (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.
                   m_data.array[1];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar20 * dVar20 + dVar16 * dVar16;
    auVar25 = sqrtpd(in_XMM4,auVar23);
    dVar22 = dVar24 * dVar20 + dVar21 * dVar16;
    dVar24 = dVar24 * dVar24 + dVar21 * dVar21;
    dVar21 = SQRT(dVar24) * auVar25._0_8_;
    auVar26._8_8_ = -(ulong)(auVar25._8_8_ < 0.0);
    auVar26._0_8_ = -(ulong)(auVar25._0_8_ < dVar17);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = -(ulong)((double)(-(ulong)(dVar21 != 0.0) & (ulong)ABS(dVar22 / dVar21)) <
                           dVar17 * 5.0);
    auVar26 = auVar26 | auVar5;
    if ((auVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_d8._0_8_ =
           (double)local_d8._0_8_ -
           dVar22 / (dVar24 + dVar20 * *(double *)
                                        ((long)local_b8.
                                               super__Tuple_impl<0UL,_double,_long,_double,_long>.
                                               super__Tuple_impl<1UL,_long,_double,_long>.
                                               super__Tuple_impl<2UL,_double,_long>.
                                               super__Tuple_impl<3UL,_long>.
                                               super__Head_base<3UL,_long,_false>._M_head_impl +
                                        0x28) +
                              dVar16 * *(double *)
                                        ((long)local_b8.
                                               super__Tuple_impl<0UL,_double,_long,_double,_long>.
                                               super__Tuple_impl<1UL,_long,_double,_long>.
                                               super__Tuple_impl<2UL,_double,_long>.
                                               super__Tuple_impl<3UL,_long>.
                                               super__Head_base<3UL,_long,_false>._M_head_impl +
                                        0x20));
      dVar21 = local_80;
      if ((double)local_d8._0_8_ <= local_80) {
        dVar21 = (double)local_d8._0_8_;
      }
      uVar14 = -(ulong)((double)local_d8._0_8_ < (double)CONCAT44(uStack_64,local_68));
      local_d8._8_8_ = local_d8._8_8_ & CONCAT44(uStack_5c,uStack_60);
      local_d8._0_8_ = uVar14 & CONCAT44(uStack_64,local_68) | ~uVar14 & (ulong)dVar21;
    }
    in_XMM4 = auVar26;
    operator_delete((void *)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                            super__Tuple_impl<1UL,_long,_double,_long>.
                            super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                            super__Head_base<3UL,_long,_false>._M_head_impl,
                    local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                    super__Tuple_impl<1UL,_long,_double,_long>.super__Head_base<1UL,_long,_false>.
                    _M_head_impl -
                    (long)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                          super__Tuple_impl<1UL,_long,_double,_long>.
                          super__Tuple_impl<2UL,_double,_long>.super__Tuple_impl<3UL,_long>.
                          super__Head_base<3UL,_long,_false>._M_head_impl);
    bVar13 = lVar11 != 0;
    lVar11 = lVar11 + -1;
  } while ((auVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0 && bVar13);
  peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_CurveBase[5])(&local_b8);
  _Var10._M_head_impl =
       local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
       super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
       super__Head_base<2UL,_double,_false>._M_head_impl;
  _Var9.super__Head_base<3UL,_long,_false>._M_head_impl =
       local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
       super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
       super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
       (_Head_base<3UL,_long,_false>)(_Head_base<3UL,_long,_false>)local_78._M_head_impl;
  local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
  super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dStack_70;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  dVar17 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0];
  dVar21 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1];
  peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (*peVar1->_vptr_CurveBase[5])(extraout_XMM0_Qa,&local_b8);
  dVar17 = dVar17 - (double)_Var9.super__Head_base<3UL,_long,_false>._M_head_impl;
  dVar21 = dVar21 - _Var10._M_head_impl;
  dVar17 = dVar21 * dVar21 + dVar17 * dVar17;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  dVar21 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[0] -
           (double)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                   super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
                   super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  dVar24 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.
           array[1] -
           local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
           super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
           super__Head_base<2UL,_double,_false>._M_head_impl;
  if (dVar17 <= dVar24 * dVar24 + dVar21 * dVar21) {
    peVar1 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var2 = (this->m_curve).super___shared_ptr<anurbs::CurveBase<2L>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (*peVar1->_vptr_CurveBase[5])(local_98,&local_58);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    dVar21 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[0] - (double)local_58;
    dVar24 = (sample->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data
             .array[1] - dStack_50;
    dVar21 = dVar24 * dVar24 + dVar21 * dVar21;
    uVar14 = -(ulong)(dVar21 < dVar17);
    local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
    super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
    super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
         (_Head_base<3UL,_long,_false>)(_Head_base<3UL,_long,_false>)local_58;
    local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
    super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
    super__Head_base<2UL,_double,_false>._M_head_impl = dStack_50;
    if (dVar17 <= dVar21) {
      local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
      super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
      super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl =
           _Var9.super__Head_base<3UL,_long,_false>._M_head_impl;
      local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
      super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
      super__Head_base<2UL,_double,_false>._M_head_impl = _Var10._M_head_impl;
    }
    this->m_parameter = (double)(~uVar14 & local_d8._0_8_ | uVar14 & (ulong)local_98);
  }
  else {
    this->m_parameter = extraout_XMM0_Qa;
  }
  (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
  array[0] = (double)local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
                     super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>
                     .super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  (this->m_point).super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
  array[1] = local_b8.super__Tuple_impl<0UL,_double,_long,_double,_long>.
             super__Tuple_impl<1UL,_long,_double,_long>.super__Tuple_impl<2UL,_double,_long>.
             super__Head_base<2UL,_double,_false>._M_head_impl;
  return;
}

Assistant:

void compute(const Vector& sample, const double max_distance = 0)
    {
        const auto domain = Curve()->domain();

        // closest point to polyline

        double closest_parameter = 0;
        Vector closest_point;

        double closest_sq_distance = Infinity;

        const auto& [ts, points] = m_tessellation;

        if (max_distance <= 0) {
            for (Index i = 1; i < length(ts); i++) {
                const auto t0 = ts[i - 1];
                const auto point0 = points[i - 1];
                const auto t1 = ts[i];
                const auto point1 = points[i];

                const auto [t, point] = project_to_line(sample, point0, point1, t0, t1);

                const Vector v = point - sample;

                const double sq_distance = squared_norm(v);

                if (sq_distance < closest_sq_distance) {
                    closest_sq_distance = sq_distance;
                    closest_parameter = t;
                    closest_point = point;
                }
            }
        } else {
            const auto [wa, idx_a, wb, idx_b] = mapper->map(sample, max_distance);

            closest_parameter = wa * ts[idx_a] + wb * ts[idx_b];
            closest_point = wa * points[idx_a] + wb * points[idx_b];
        }

        // newton-raphson

        const Index max_iter = 5;
        const double eps1 = tolerance();
        const double eps2 = tolerance() * 5;

        for (Index i = 0; i < max_iter; i++) {
            auto f = Curve()->derivatives_at(closest_parameter, 2);

            Vector dif = f[0] - sample;

            double c1v = norm(dif);

            double c2n = dot(f[1], dif);
            double c2d = norm(f[1]) * c1v;
            double c2v = c2d != 0 ? c2n / c2d : 0;

            bool c1 = c1v < eps1;
            bool c2 = std::abs(c2v) < eps2;

            if (c1 || c2) { // FIXME: check if 'or' is correct (NURBS Book P.231)
                break;
            }

            double delta = dot(f[1], dif) / (dot(f[2], dif) + squared_norm(f[1]));

            double nextParameter = closest_parameter - delta;

            // FIXME: out-of-domain check

            // FIXME: 3. condition: (nextParameter - closest_parameter) * f[1].norm();

            closest_parameter = domain.clamp(nextParameter);
        }

        closest_point = Curve()->point_at(closest_parameter);

        closest_sq_distance = squared_norm(Vector(sample - closest_point));

        Vector point_at_t0 = Curve()->point_at(domain.t0());

        if (squared_norm(Vector(sample - point_at_t0)) < closest_sq_distance) {
            m_parameter = domain.t0();
            m_point = point_at_t0;
            return;
        }

        Vector point_at_t1 = Curve()->point_at(domain.t1());

        if (squared_norm(Vector(sample - point_at_t1)) < closest_sq_distance) {
            m_parameter = domain.t1();
            m_point = point_at_t1;
            return;
        }

        m_parameter = closest_parameter;
        m_point = closest_point;
    }